

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
ModbusSimulationDataGenerator::SendReadFIFOQueueResponse
          (ModbusSimulationDataGenerator *this,U8 DeviceID,U16 ByteCount,U16 FIFOCount,U16 *Values)

{
  int iVar1;
  char cVar2;
  U16 UVar3;
  ushort uVar4;
  int local_38;
  int local_34;
  int i_3;
  int i_2;
  U16 LRCvalue;
  int i_1;
  U16 CRCValue;
  int i;
  U16 *Values_local;
  U16 FIFOCount_local;
  U16 ByteCount_local;
  U8 DeviceID_local;
  ModbusSimulationDataGenerator *this_local;
  
  iVar1 = (int)this;
  if (this->mSettings->mModbusMode == ModbusRTUServer) {
    CreateModbusByte(this,(ulong)DeviceID);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,0x18);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,(long)(int)(ByteCount & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,(long)((int)(ByteCount & 0xff00) >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,(long)(int)(FIFOCount & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,(long)((int)(FIFOCount & 0xff00) >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    for (i_1 = 0; i_1 < (int)(uint)FIFOCount; i_1 = i_1 + 1) {
      CreateModbusByte(this,(long)(int)(Values[i_1] & 0xff));
      ClockGenerator::AdvanceByHalfPeriod(10.0);
      SimulationChannelDescriptor::Advance(iVar1 + 0x30);
      CreateModbusByte(this,(long)((int)(Values[i_1] & 0xff00) >> 8));
      ClockGenerator::AdvanceByHalfPeriod(10.0);
      SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    }
    UVar3 = update_CRC(this,0xffff,DeviceID);
    UVar3 = update_CRC(this,UVar3,'\x18');
    UVar3 = update_CRC(this,UVar3,(U8)ByteCount);
    UVar3 = update_CRC(this,UVar3,(U8)(ByteCount >> 8));
    UVar3 = update_CRC(this,UVar3,(U8)FIFOCount);
    LRCvalue = update_CRC(this,UVar3,(U8)(FIFOCount >> 8));
    for (i_2 = 0; i_2 < (int)(uint)FIFOCount; i_2 = i_2 + 1) {
      UVar3 = update_CRC(this,LRCvalue,(U8)Values[i_2]);
      LRCvalue = update_CRC(this,UVar3,(U8)(Values[i_2] >> 8));
    }
    CreateModbusByte(this,(long)(int)(LRCvalue & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,(long)((int)(LRCvalue & 0xff00) >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
  }
  else {
    i_3._2_2_ = ((DeviceID + 0x18 + ByteCount & 0xff) + (ByteCount >> 8) + FIFOCount & 0xff) +
                (FIFOCount >> 8);
    for (local_34 = 0; local_34 < (int)(uint)FIFOCount; local_34 = local_34 + 1) {
      i_3._2_2_ = (i_3._2_2_ + Values[local_34] & 0xff) + (Values[local_34] >> 8);
    }
    uVar4 = (i_3._2_2_ ^ 0xffff) + 1;
    CreateModbusByte(this,0x3a);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((int)(uint)DeviceID >> 4));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,DeviceID & 0xf);
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,'\x01');
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,'\b');
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((int)(ByteCount & 0xf000) >> 0xc));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((ByteCount & 0xf0f) >> 8));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((int)(ByteCount & 0xf0) >> 4));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)(ByteCount & 0xf0f));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((int)(FIFOCount & 0xf000) >> 0xc));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((FIFOCount & 0xf0f) >> 8));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((int)(FIFOCount & 0xf0) >> 4));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)(FIFOCount & 0xf0f));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    for (local_38 = 0; local_38 < (int)(uint)FIFOCount; local_38 = local_38 + 1) {
      cVar2 = BinToLATIN1(this,(U8)((int)(Values[local_38] & 0xf000) >> 0xc));
      CreateModbusByte(this,(long)cVar2);
      ClockGenerator::AdvanceByHalfPeriod(10.0);
      SimulationChannelDescriptor::Advance(iVar1 + 0x30);
      cVar2 = BinToLATIN1(this,(byte)(Values[local_38] >> 8) & 0xf);
      CreateModbusByte(this,(long)cVar2);
      ClockGenerator::AdvanceByHalfPeriod(10.0);
      SimulationChannelDescriptor::Advance(iVar1 + 0x30);
      cVar2 = BinToLATIN1(this,(U8)((int)(Values[local_38] & 0xf0) >> 4));
      CreateModbusByte(this,(long)cVar2);
      ClockGenerator::AdvanceByHalfPeriod(10.0);
      SimulationChannelDescriptor::Advance(iVar1 + 0x30);
      cVar2 = BinToLATIN1(this,(byte)Values[local_38] & 0xf);
      CreateModbusByte(this,(long)cVar2);
      ClockGenerator::AdvanceByHalfPeriod(10.0);
      SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    }
    cVar2 = BinToLATIN1(this,(U8)((int)((uVar4 & 0xff) & 0xf0) >> 4));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(byte)uVar4 & 0xf);
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,0xd);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,10);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
  }
  return;
}

Assistant:

void ModbusSimulationDataGenerator::SendReadFIFOQueueResponse( U8 DeviceID, U16 ByteCount, U16 FIFOCount, U16 Values[] )
{
    if( mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusRTUServer )
    {
        CreateModbusByte( DeviceID );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( 0x18 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ByteCount & 0x00FF );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( ByteCount & 0xFF00 ) >> 8 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( FIFOCount & 0x00FF );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( FIFOCount & 0xFF00 ) >> 8 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        for( int i = 0; i < FIFOCount; i++ )
        {
            CreateModbusByte( Values[ i ] & 0x00FF );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

            CreateModbusByte( ( Values[ i ] & 0xFF00 ) >> 8 );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
        }

        U16 CRCValue = 0xFFFF; // Modbus/RTU uses CRC-16, calls for initialization to 0xFFFF
        CRCValue = update_CRC( CRCValue, DeviceID );
        CRCValue = update_CRC( CRCValue, 0x18 );
        CRCValue = update_CRC( CRCValue, ByteCount & 0x00FF );
        CRCValue = update_CRC( CRCValue, ( ByteCount & 0xFF00 ) >> 8 );
        CRCValue = update_CRC( CRCValue, FIFOCount & 0x00FF );
        CRCValue = update_CRC( CRCValue, ( FIFOCount & 0xFF00 ) >> 8 );

        for( int i = 0; i < FIFOCount; i++ )
        {
            CRCValue = update_CRC( CRCValue, Values[ i ] & 0x00FF );
            CRCValue = update_CRC( CRCValue, ( Values[ i ] & 0xFF00 ) >> 8 );
        }

        CreateModbusByte( ( CRCValue & 0x00FF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( ( CRCValue & 0xFF00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
    }
    else
    {
        // it's easier to compute the LRC before converting the data from binary to ASCII
        U16 LRCvalue = 0x00; // Modbus/ASCII uses LRC, initialization to 0x00;

        LRCvalue = LRCvalue + DeviceID;
        LRCvalue = LRCvalue + 0x18;
        LRCvalue = LRCvalue + ByteCount & 0x00FF;
        LRCvalue = LRCvalue + ( ( ByteCount & 0xFF00 ) >> 8 );
        LRCvalue = LRCvalue + FIFOCount & 0x00FF;
        LRCvalue = LRCvalue + ( ( FIFOCount & 0xFF00 ) >> 8 );

        for( int i = 0; i < FIFOCount; i++ )
        {
            LRCvalue = LRCvalue + Values[ i ] & 0x00FF;
            LRCvalue = LRCvalue + ( ( Values[ i ] & 0xFF00 ) >> 8 );
        }

        LRCvalue = ~LRCvalue + 1;
        LRCvalue = LRCvalue & 0x00FF;

        CreateModbusByte( ':' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( 0x1 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( 0x8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( ByteCount & 0xF000 ) >> 12 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( ByteCount & 0x0F00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( ByteCount & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ByteCount & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( FIFOCount & 0xF000 ) >> 12 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( FIFOCount & 0x0F00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( FIFOCount & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( FIFOCount & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );


        for( int i = 0; i < FIFOCount; i++ )
        {
            CreateModbusByte( BinToLATIN1( ( Values[ i ] & 0xF000 ) >> 12 ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
            CreateModbusByte( BinToLATIN1( ( Values[ i ] & 0x0F00 ) >> 8 ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
            CreateModbusByte( BinToLATIN1( ( Values[ i ] & 0xF0 ) >> 4 ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
            CreateModbusByte( BinToLATIN1( Values[ i ] & 0xF ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        }

        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF ) ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '\r' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( '\n' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
    }
}